

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brg_sha1.c
# Opt level: O1

void sha1_compile(sha1_ctx *ctx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint_32t uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  
  uVar1 = ctx->hash[0];
  uVar2 = ctx->hash[1];
  uVar3 = ctx->hash[2];
  uVar4 = ctx->hash[3];
  uVar5 = ctx->hash[4];
  uVar12 = uVar2 << 0x1e | uVar2 >> 2;
  uVar9 = (uVar1 << 5 | uVar1 >> 0x1b) + ctx->wbuf[0] + uVar5 + ((uVar4 ^ uVar3) & uVar2 ^ uVar4) +
          0x5a827999;
  uVar22 = uVar1 << 0x1e | uVar1 >> 2;
  uVar15 = ((uVar12 ^ uVar3) & uVar1 ^ uVar3) + uVar4 + ctx->wbuf[1] + 0x5a827999 +
           (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar7 = ctx->wbuf[2];
  uVar8 = ((uVar12 ^ uVar22) & uVar9 ^ uVar12) + uVar3 + uVar7 + 0x5a827999 +
          (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar10 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar9 = ctx->wbuf[3];
  uVar16 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar15 = uVar12 + uVar9 + ((uVar10 ^ uVar22) & uVar15 ^ uVar22) + 0x5a827999 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar12 = ctx->wbuf[4];
  uVar23 = uVar22 + uVar12 + ((uVar16 ^ uVar10) & uVar8 ^ uVar10) + 0x5a827999 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar22 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar8 = ctx->wbuf[5];
  uVar13 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar11 = uVar10 + uVar8 + ((uVar22 ^ uVar16) & uVar15 ^ uVar16) + 0x5a827999 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar10 = ctx->wbuf[6];
  uVar17 = uVar16 + uVar10 + ((uVar13 ^ uVar22) & uVar23 ^ uVar22) + 0x5a827999 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar24 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar15 = ctx->wbuf[7];
  uVar23 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar16 = uVar22 + uVar15 + ((uVar24 ^ uVar13) & uVar11 ^ uVar13) + 0x5a827999 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar22 = ctx->wbuf[8];
  uVar13 = uVar13 + uVar22 + ((uVar23 ^ uVar24) & uVar17 ^ uVar24) + 0x5a827999 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar18 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar11 = ctx->wbuf[9];
  uVar17 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar25 = uVar24 + uVar11 + ((uVar18 ^ uVar23) & uVar16 ^ uVar23) + 0x5a827999 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar16 = ctx->wbuf[10];
  uVar24 = uVar23 + uVar16 + ((uVar17 ^ uVar18) & uVar13 ^ uVar18) + 0x5a827999 +
           (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar14 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar23 = ctx->wbuf[0xb];
  uVar26 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar19 = uVar18 + uVar23 + ((uVar14 ^ uVar17) & uVar25 ^ uVar17) + 0x5a827999 +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar13 = ctx->wbuf[0xc];
  uVar18 = uVar17 + uVar13 + ((uVar26 ^ uVar14) & uVar24 ^ uVar14) + 0x5a827999 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar25 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar17 = ctx->wbuf[0xd];
  uVar20 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar19 = uVar14 + uVar17 + ((uVar25 ^ uVar26) & uVar19 ^ uVar26) + 0x5a827999 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar24 = ctx->wbuf[0xe];
  uVar27 = uVar26 + uVar24 + ((uVar20 ^ uVar25) & uVar18 ^ uVar25) + 0x5a827999 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar14 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar18 = ctx->wbuf[0xf];
  uVar26 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar19 = uVar25 + uVar18 + ((uVar14 ^ uVar20) & uVar19 ^ uVar20) + 0x5a827999 +
           (uVar27 * 0x20 | uVar27 >> 0x1b);
  uVar25 = uVar22 ^ uVar17 ^ ctx->wbuf[0] ^ uVar7;
  uVar30 = uVar25 << 1 | (uint)((int)uVar25 < 0);
  uVar21 = uVar20 + uVar30 + ((uVar26 ^ uVar14) & uVar27 ^ uVar14) + 0x5a827999 +
           (uVar19 * 0x20 | uVar19 >> 0x1b);
  uVar25 = uVar11 ^ uVar24 ^ ctx->wbuf[1] ^ uVar9;
  uVar27 = uVar27 * 0x40000000 | uVar27 >> 2;
  uVar31 = uVar25 << 1 | (uint)((int)uVar25 < 0);
  uVar25 = uVar14 + uVar31 + ((uVar27 ^ uVar26) & uVar19 ^ uVar26) + 0x5a827999 +
           (uVar21 * 0x20 | uVar21 >> 0x1b);
  uVar7 = uVar16 ^ uVar18 ^ uVar7 ^ uVar12;
  uVar20 = uVar19 * 0x40000000 | uVar19 >> 2;
  uVar14 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar26 = uVar26 + uVar14 + ((uVar20 ^ uVar27) & uVar21 ^ uVar27) + 0x5a827999 +
           (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar21 = uVar21 * 0x40000000 | uVar21 >> 2;
  uVar7 = uVar9 ^ uVar8 ^ uVar23 ^ uVar30;
  uVar19 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar28 = uVar27 + uVar19 + ((uVar21 ^ uVar20) & uVar25 ^ uVar20) + 0x5a827999 +
           (uVar26 * 0x20 | uVar26 >> 0x1b);
  uVar25 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar7 = uVar12 ^ uVar10 ^ uVar13 ^ uVar31;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar20 = uVar20 + uVar7 + (uVar25 ^ uVar21 ^ uVar26) + 0x6ed9eba1 +
           (uVar28 * 0x20 | uVar28 >> 0x1b);
  uVar26 = uVar26 * 0x40000000 | uVar26 >> 2;
  uVar9 = uVar8 ^ uVar15 ^ uVar17 ^ uVar14;
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar27 = uVar21 + uVar9 + (uVar26 ^ uVar25 ^ uVar28) + 0x6ed9eba1 +
           (uVar20 * 0x20 | uVar20 >> 0x1b);
  uVar29 = uVar28 * 0x40000000 | uVar28 >> 2;
  uVar12 = uVar10 ^ uVar22 ^ uVar24 ^ uVar19;
  uVar32 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar12 = uVar25 + uVar32 + (uVar29 ^ uVar26 ^ uVar20) + 0x6ed9eba1 +
           (uVar27 * 0x20 | uVar27 >> 0x1b);
  uVar20 = uVar20 * 0x40000000 | uVar20 >> 2;
  uVar8 = uVar15 ^ uVar11 ^ uVar18 ^ uVar7;
  uVar21 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar28 = uVar27 * 0x40000000 | uVar27 >> 2;
  uVar26 = uVar26 + uVar21 + (uVar20 ^ uVar29 ^ uVar27) + 0x6ed9eba1 +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar8 = uVar22 ^ uVar16 ^ uVar30 ^ uVar9;
  uVar25 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar22 = uVar29 + uVar25 + (uVar28 ^ uVar20 ^ uVar12) + 0x6ed9eba1 +
           (uVar26 * 0x20 | uVar26 >> 0x1b);
  uVar8 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar12 = uVar11 ^ uVar23 ^ uVar31 ^ uVar32;
  uVar10 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar15 = uVar20 + uVar10 + (uVar8 ^ uVar28 ^ uVar26) + 0x6ed9eba1 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar20 = uVar26 * 0x40000000 | uVar26 >> 2;
  uVar12 = uVar16 ^ uVar13 ^ uVar14 ^ uVar21;
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar26 = uVar28 + uVar12 + (uVar20 ^ uVar8 ^ uVar22) + 0x6ed9eba1 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar27 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar22 = uVar23 ^ uVar17 ^ uVar19 ^ uVar25;
  uVar28 = uVar22 << 1 | (uint)((int)uVar22 < 0);
  uVar22 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar8 = uVar8 + uVar28 + (uVar27 ^ uVar20 ^ uVar15) + 0x6ed9eba1 +
          (uVar26 * 0x20 | uVar26 >> 0x1b);
  uVar15 = uVar13 ^ uVar24 ^ uVar7 ^ uVar10;
  uVar11 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar16 = uVar20 + uVar11 + (uVar22 ^ uVar27 ^ uVar26) + 0x6ed9eba1 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar13 = uVar26 * 0x40000000 | uVar26 >> 2;
  uVar15 = uVar17 ^ uVar18 ^ uVar9 ^ uVar12;
  uVar33 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar17 = uVar27 + uVar33 + (uVar13 ^ uVar22 ^ uVar8) + 0x6ed9eba1 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar15 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar8 = uVar24 ^ uVar30 ^ uVar32 ^ uVar28;
  uVar8 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar22 = uVar22 + uVar8 + (uVar15 ^ uVar13 ^ uVar16) + 0x6ed9eba1 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar23 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar16 = uVar18 ^ uVar31 ^ uVar21 ^ uVar11;
  uVar26 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  uVar18 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar13 = uVar13 + uVar26 + (uVar23 ^ uVar15 ^ uVar17) + 0x6ed9eba1 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar16 = uVar30 ^ uVar14 ^ uVar25 ^ uVar33;
  uVar20 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  uVar15 = uVar15 + uVar20 + (uVar18 ^ uVar23 ^ uVar22) + 0x6ed9eba1 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar16 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar22 = uVar31 ^ uVar19 ^ uVar10 ^ uVar8;
  uVar29 = uVar22 << 1 | (uint)((int)uVar22 < 0);
  uVar23 = uVar23 + uVar29 + (uVar16 ^ uVar18 ^ uVar13) + 0x6ed9eba1 +
           (uVar15 * 0x20 | uVar15 >> 0x1b);
  uVar24 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar22 = uVar14 ^ uVar7 ^ uVar12 ^ uVar26;
  uVar17 = uVar22 << 1 | (uint)((int)uVar22 < 0);
  uVar18 = uVar18 + uVar17 + (uVar24 ^ uVar16 ^ uVar15) + 0x6ed9eba1 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar22 = uVar15 * 0x40000000 | uVar15 >> 2;
  uVar15 = uVar19 ^ uVar9 ^ uVar28 ^ uVar20;
  uVar19 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar13 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar23 = uVar16 + uVar19 + (uVar22 ^ uVar24 ^ uVar23) + 0x6ed9eba1 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar7 = uVar7 ^ uVar32 ^ uVar11 ^ uVar29;
  uVar16 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar24 = uVar24 + uVar16 + (uVar13 ^ uVar22 ^ uVar18) + 0x6ed9eba1 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar7 = uVar9 ^ uVar21 ^ uVar33 ^ uVar17;
  uVar15 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar9 = uVar22 + uVar15 + (uVar18 ^ uVar13 ^ uVar23) + 0x6ed9eba1 +
          (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar23 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar7 = uVar32 ^ uVar25 ^ uVar8 ^ uVar19;
  uVar27 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar13 = uVar13 + uVar27 + (uVar23 ^ uVar18 ^ uVar24) + 0x6ed9eba1 +
           (uVar9 * 0x20 | uVar9 >> 0x1b);
  uVar24 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar7 = uVar21 ^ uVar10 ^ uVar26 ^ uVar16;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar22 = uVar9 * 0x40000000 | uVar9 >> 2;
  uVar14 = uVar18 + uVar7 + (uVar24 ^ uVar23 ^ uVar9) + 0x6ed9eba1 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar9 = uVar25 ^ uVar12 ^ uVar20 ^ uVar15;
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar23 = uVar23 + uVar9 + ((uVar13 ^ uVar22) & uVar24 | uVar13 & uVar22) + -0x70e44324 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar13 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar10 = uVar10 ^ uVar28 ^ uVar29 ^ uVar27;
  uVar10 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar18 = uVar24 + uVar10 + ((uVar14 ^ uVar13) & uVar22 | uVar14 & uVar13) + -0x70e44324 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar14 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar12 = uVar12 ^ uVar11 ^ uVar17 ^ uVar7;
  uVar31 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar22 = uVar22 + uVar31 + ((uVar23 ^ uVar14) & uVar13 | uVar23 & uVar14) + -0x70e44324 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar23 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar12 = uVar28 ^ uVar33 ^ uVar19 ^ uVar9;
  uVar24 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar13 = uVar13 + uVar24 + ((uVar18 ^ uVar23) & uVar14 | uVar18 & uVar23) + -0x70e44324 +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar12 = uVar11 ^ uVar8 ^ uVar16 ^ uVar10;
  uVar12 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar14 = uVar14 + uVar12 + ((uVar22 ^ uVar18) & uVar23 | uVar22 & uVar18) + -0x70e44324 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar11 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar22 = uVar33 ^ uVar26 ^ uVar15 ^ uVar31;
  uVar32 = uVar22 << 1 | (uint)((int)uVar22 < 0);
  uVar23 = uVar23 + uVar32 + ((uVar13 ^ uVar11) & uVar18 | uVar13 & uVar11) + -0x70e44324 +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar13 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar8 = uVar8 ^ uVar20 ^ uVar27 ^ uVar24;
  uVar21 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar18 = uVar18 + uVar21 + ((uVar14 ^ uVar13) & uVar11 | uVar14 & uVar13) + -0x70e44324 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar14 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar8 = uVar26 ^ uVar29 ^ uVar7 ^ uVar12;
  uVar22 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar8 = uVar11 + uVar22 + ((uVar23 ^ uVar14) & uVar13 | uVar23 & uVar14) + -0x70e44324 +
          (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar11 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar23 = uVar20 ^ uVar17 ^ uVar9 ^ uVar32;
  uVar25 = uVar23 << 1 | (uint)((int)uVar23 < 0);
  uVar23 = uVar13 + uVar25 + ((uVar18 ^ uVar11) & uVar14 | uVar18 & uVar11) + -0x70e44324 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar13 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar18 = uVar29 ^ uVar19 ^ uVar10 ^ uVar21;
  uVar30 = uVar18 << 1 | (uint)((int)uVar18 < 0);
  uVar18 = uVar14 + uVar30 + ((uVar8 ^ uVar13) & uVar11 | uVar8 & uVar13) + -0x70e44324 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar8 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar17 = uVar17 ^ uVar16 ^ uVar31 ^ uVar22;
  uVar14 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar11 = uVar11 + uVar14 + ((uVar23 ^ uVar8) & uVar13 | uVar23 & uVar8) + -0x70e44324 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar23 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar17 = uVar19 ^ uVar15 ^ uVar24 ^ uVar25;
  uVar20 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar13 = uVar13 + uVar20 + ((uVar18 ^ uVar23) & uVar8 | uVar18 & uVar23) + -0x70e44324 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar17 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar16 = uVar16 ^ uVar27 ^ uVar12 ^ uVar30;
  uVar26 = uVar16 << 1 | (uint)((int)uVar16 < 0);
  uVar8 = uVar8 + uVar26 + ((uVar11 ^ uVar17) & uVar23 | uVar11 & uVar17) + -0x70e44324 +
          (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar11 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar15 = uVar15 ^ uVar7 ^ uVar32 ^ uVar14;
  uVar28 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar23 = uVar23 + uVar28 + ((uVar13 ^ uVar11) & uVar17 | uVar13 & uVar11) + -0x70e44324 +
           (uVar8 * 0x20 | uVar8 >> 0x1b);
  uVar13 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar15 = uVar27 ^ uVar9 ^ uVar21 ^ uVar20;
  uVar27 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar18 = uVar17 + uVar27 + ((uVar8 ^ uVar13) & uVar11 | uVar8 & uVar13) + -0x70e44324 +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar15 = uVar8 * 0x40000000 | uVar8 >> 2;
  uVar7 = uVar7 ^ uVar10 ^ uVar22 ^ uVar26;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar16 = uVar11 + uVar7 + ((uVar23 ^ uVar15) & uVar13 | uVar23 & uVar15) + -0x70e44324 +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  uVar23 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar9 = uVar9 ^ uVar31 ^ uVar25 ^ uVar28;
  uVar8 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar17 = uVar13 + uVar8 + ((uVar18 ^ uVar23) & uVar15 | uVar18 & uVar23) + -0x70e44324 +
           (uVar16 * 0x20 | uVar16 >> 0x1b);
  uVar18 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar9 = uVar10 ^ uVar24 ^ uVar30 ^ uVar27;
  uVar10 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar11 = uVar15 + uVar10 + ((uVar16 ^ uVar18) & uVar23 | uVar16 & uVar18) + -0x70e44324 +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar16 = uVar16 * 0x40000000 | uVar16 >> 2;
  uVar9 = uVar31 ^ uVar12 ^ uVar14 ^ uVar7;
  uVar9 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  uVar13 = uVar23 + uVar9 + ((uVar17 ^ uVar16) & uVar18 | uVar17 & uVar16) + -0x70e44324 +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar15 = uVar24 ^ uVar32 ^ uVar20 ^ uVar8;
  uVar15 = uVar15 << 1 | (uint)((int)uVar15 < 0);
  uVar24 = uVar18 + uVar15 + ((uVar11 ^ uVar17) & uVar16 | uVar11 & uVar17) + -0x70e44324 +
           (uVar13 * 0x20 | uVar13 >> 0x1b);
  uVar11 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar12 = uVar12 ^ uVar21 ^ uVar26 ^ uVar10;
  uVar29 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar23 = uVar16 + uVar29 + (uVar11 ^ uVar17 ^ uVar13) + -0x359d3e2a +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar13 = uVar13 * 0x40000000 | uVar13 >> 2;
  uVar12 = uVar32 ^ uVar22 ^ uVar28 ^ uVar9;
  uVar31 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar18 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar17 = uVar17 + uVar31 + (uVar13 ^ uVar11 ^ uVar24) + -0x359d3e2a +
           (uVar23 * 0x20 | uVar23 >> 0x1b);
  uVar12 = uVar21 ^ uVar25 ^ uVar27 ^ uVar15;
  uVar16 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar12 = uVar11 + uVar16 + (uVar18 ^ uVar13 ^ uVar23) + -0x359d3e2a +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar11 = uVar23 * 0x40000000 | uVar23 >> 2;
  uVar22 = uVar22 ^ uVar30 ^ uVar7 ^ uVar29;
  uVar23 = uVar22 << 1 | (uint)((int)uVar22 < 0);
  uVar22 = uVar13 + uVar23 + (uVar11 ^ uVar18 ^ uVar17) + -0x359d3e2a +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar13 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar17 = uVar25 ^ uVar14 ^ uVar8 ^ uVar31;
  uVar19 = uVar17 << 1 | (uint)((int)uVar17 < 0);
  uVar17 = uVar18 + uVar19 + (uVar13 ^ uVar11 ^ uVar12) + -0x359d3e2a +
           (uVar22 * 0x20 | uVar22 >> 0x1b);
  uVar12 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar24 = uVar30 ^ uVar20 ^ uVar10 ^ uVar16;
  uVar21 = uVar24 << 1 | (uint)((int)uVar24 < 0);
  uVar24 = uVar22 * 0x40000000 | uVar22 >> 2;
  uVar11 = uVar11 + uVar21 + (uVar12 ^ uVar13 ^ uVar22) + -0x359d3e2a +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar22 = uVar14 ^ uVar26 ^ uVar9 ^ uVar23;
  uVar18 = uVar22 << 1 | (uint)((int)uVar22 < 0);
  uVar14 = uVar13 + uVar18 + (uVar24 ^ uVar12 ^ uVar17) + -0x359d3e2a +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  uVar25 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar22 = uVar20 ^ uVar28 ^ uVar15 ^ uVar19;
  uVar13 = uVar22 << 1 | (uint)((int)uVar22 < 0);
  uVar12 = uVar12 + uVar13 + (uVar25 ^ uVar24 ^ uVar11) + -0x359d3e2a +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar17 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar22 = uVar26 ^ uVar27 ^ uVar29 ^ uVar21;
  uVar26 = uVar22 << 1 | (uint)((int)uVar22 < 0);
  uVar24 = uVar24 + uVar26 + (uVar17 ^ uVar25 ^ uVar14) + -0x359d3e2a +
           (uVar12 * 0x20 | uVar12 >> 0x1b);
  uVar14 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar22 = uVar28 ^ uVar7 ^ uVar31 ^ uVar18;
  uVar20 = uVar22 << 1 | (uint)((int)uVar22 < 0);
  uVar11 = uVar12 * 0x40000000 | uVar12 >> 2;
  uVar25 = uVar25 + uVar20 + (uVar14 ^ uVar17 ^ uVar12) + -0x359d3e2a +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  uVar12 = uVar27 ^ uVar8 ^ uVar16 ^ uVar13;
  uVar22 = uVar12 << 1 | (uint)((int)uVar12 < 0);
  uVar17 = uVar17 + uVar22 + (uVar11 ^ uVar14 ^ uVar24) + -0x359d3e2a +
           (uVar25 * 0x20 | uVar25 >> 0x1b);
  uVar24 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar7 = uVar7 ^ uVar10 ^ uVar23 ^ uVar26;
  uVar12 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar14 = uVar14 + uVar12 + (uVar24 ^ uVar11 ^ uVar25) + -0x359d3e2a +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar25 = uVar25 * 0x40000000 | uVar25 >> 2;
  uVar7 = uVar8 ^ uVar9 ^ uVar19 ^ uVar20;
  uVar8 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar11 = uVar11 + uVar8 + (uVar25 ^ uVar24 ^ uVar17) + -0x359d3e2a +
           (uVar14 * 0x20 | uVar14 >> 0x1b);
  uVar17 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar7 = uVar10 ^ uVar15 ^ uVar21 ^ uVar22;
  uVar10 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar24 = uVar24 + uVar10 + (uVar17 ^ uVar25 ^ uVar14) + -0x359d3e2a +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  ctx->wbuf[0] = uVar19;
  ctx->wbuf[1] = uVar21;
  ctx->wbuf[2] = uVar18;
  uVar14 = uVar14 * 0x40000000 | uVar14 >> 2;
  uVar7 = uVar9 ^ uVar29 ^ uVar18 ^ uVar12;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  uVar18 = uVar25 + uVar7 + (uVar14 ^ uVar17 ^ uVar11) + -0x359d3e2a +
           (uVar24 * 0x20 | uVar24 >> 0x1b);
  ctx->wbuf[3] = uVar13;
  ctx->wbuf[4] = uVar26;
  ctx->wbuf[5] = uVar20;
  ctx->wbuf[6] = uVar22;
  ctx->wbuf[7] = uVar12;
  ctx->wbuf[8] = uVar8;
  uVar8 = uVar15 ^ uVar31 ^ uVar13 ^ uVar8;
  uVar15 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar9 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  uVar11 = uVar17 + uVar9 + (uVar15 ^ uVar14 ^ uVar24) + -0x359d3e2a +
           (uVar18 * 0x20 | uVar18 >> 0x1b);
  ctx->wbuf[9] = uVar10;
  uVar10 = uVar29 ^ uVar16 ^ uVar26 ^ uVar10;
  uVar13 = uVar24 * 0x40000000 | uVar24 >> 2;
  uVar8 = uVar10 << 1 | (uint)((int)uVar10 < 0);
  uVar17 = uVar14 + uVar8 + (uVar13 ^ uVar15 ^ uVar18) + -0x359d3e2a +
           (uVar11 * 0x20 | uVar11 >> 0x1b);
  ctx->wbuf[10] = uVar7;
  uVar7 = uVar31 ^ uVar23 ^ uVar20 ^ uVar7;
  ctx->wbuf[0xb] = uVar9;
  ctx->wbuf[0xc] = uVar8;
  uVar7 = uVar7 << 1 | (uint)((int)uVar7 < 0);
  ctx->wbuf[0xd] = uVar7;
  uVar24 = uVar18 * 0x40000000 | uVar18 >> 2;
  uVar10 = uVar7 + uVar15 + (uVar24 ^ uVar13 ^ uVar11) + -0x359d3e2a +
           (uVar17 * 0x20 | uVar17 >> 0x1b);
  uVar15 = uVar11 * 0x40000000 | uVar11 >> 2;
  uVar9 = uVar19 ^ uVar16 ^ uVar22 ^ uVar9;
  uVar7 = uVar9 << 1 | (uint)((int)uVar9 < 0);
  ctx->wbuf[0xe] = uVar7;
  iVar6 = uVar7 + uVar13 + (uVar15 ^ uVar24 ^ uVar17) + (uVar10 * 0x20 | uVar10 >> 0x1b);
  uVar8 = uVar21 ^ uVar23 ^ uVar12 ^ uVar8;
  uVar12 = uVar8 << 1 | (uint)((int)uVar8 < 0);
  ctx->wbuf[0xf] = uVar12;
  uVar9 = uVar17 * 0x40000000 | uVar17 >> 2;
  uVar7 = iVar6 + 0xca62c1d6;
  ctx->hash[0] = uVar12 + uVar1 + uVar24 + (uVar9 ^ uVar15 ^ uVar10) + -0x359d3e2a +
                 (uVar7 * 0x20 | uVar7 >> 0x1b);
  ctx->hash[1] = uVar2 + iVar6 + 0xca62c1d6;
  ctx->hash[2] = (uVar10 * 0x40000000 | uVar10 >> 2) + uVar3;
  ctx->hash[3] = uVar9 + uVar4;
  ctx->hash[4] = uVar15 + uVar5;
  return;
}

Assistant:

VOID_RETURN sha1_compile(sha1_ctx ctx[1])
{   uint_32t    *w = ctx->wbuf;

#ifdef ARRAY
    uint_32t    v[5];
    memcpy(v, ctx->hash, 5 * sizeof(uint_32t));
#else
    uint_32t    v0, v1, v2, v3, v4;
    v0 = ctx->hash[0]; v1 = ctx->hash[1];
    v2 = ctx->hash[2]; v3 = ctx->hash[3];
    v4 = ctx->hash[4];
#endif

#define hf(i)   w[i]

    five_cycle(v, ch, 0x5a827999,  0);
    five_cycle(v, ch, 0x5a827999,  5);
    five_cycle(v, ch, 0x5a827999, 10);
    one_cycle(v,0,1,2,3,4, ch, 0x5a827999, hf(15)); \

#undef  hf
#define hf(i) (w[(i) & 15] = rotl32(                    \
                 w[((i) + 13) & 15] ^ w[((i) + 8) & 15] \
               ^ w[((i) +  2) & 15] ^ w[(i) & 15], 1))

    one_cycle(v,4,0,1,2,3, ch, 0x5a827999, hf(16));
    one_cycle(v,3,4,0,1,2, ch, 0x5a827999, hf(17));
    one_cycle(v,2,3,4,0,1, ch, 0x5a827999, hf(18));
    one_cycle(v,1,2,3,4,0, ch, 0x5a827999, hf(19));

    five_cycle(v, parity, 0x6ed9eba1,  20);
    five_cycle(v, parity, 0x6ed9eba1,  25);
    five_cycle(v, parity, 0x6ed9eba1,  30);
    five_cycle(v, parity, 0x6ed9eba1,  35);

    five_cycle(v, maj, 0x8f1bbcdc,  40);
    five_cycle(v, maj, 0x8f1bbcdc,  45);
    five_cycle(v, maj, 0x8f1bbcdc,  50);
    five_cycle(v, maj, 0x8f1bbcdc,  55);

    five_cycle(v, parity, 0xca62c1d6,  60);
    five_cycle(v, parity, 0xca62c1d6,  65);
    five_cycle(v, parity, 0xca62c1d6,  70);
    five_cycle(v, parity, 0xca62c1d6,  75);

#ifdef ARRAY
    ctx->hash[0] += v[0]; ctx->hash[1] += v[1];
    ctx->hash[2] += v[2]; ctx->hash[3] += v[3];
    ctx->hash[4] += v[4];
#else
    ctx->hash[0] += v0; ctx->hash[1] += v1;
    ctx->hash[2] += v2; ctx->hash[3] += v3;
    ctx->hash[4] += v4;
#endif
}